

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

void Acec_MatchBoxesSort(int *pArray,int nSize,int *pCostLits)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int t;
  int best_i;
  int j;
  int i;
  int *pCostLits_local;
  int nSize_local;
  int *pArray_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    local_2c = best_i;
    t = best_i;
    while (t = t + 1, t < nSize) {
      iVar1 = Abc_Lit2LitL(pCostLits,pArray[t]);
      iVar2 = Abc_Lit2LitL(pCostLits,pArray[local_2c]);
      if (iVar2 < iVar1) {
        local_2c = t;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[local_2c];
    pArray[local_2c] = iVar1;
  }
  return;
}

Assistant:

void Acec_MatchBoxesSort( int * pArray, int nSize, int * pCostLits )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Abc_Lit2LitL(pCostLits, pArray[j]) > Abc_Lit2LitL(pCostLits, pArray[best_i]) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}